

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::CheckArrayBufferImmutableFlag
          (FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  GLint is_storage_immutable;
  GLint local_194;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_194 = -1;
  (*this->m_pGetNamedBufferParameteriv)(this->m_bo_in,0x821f,&local_194);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 == 0) {
    if (local_194 == -1) {
      local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_190 + 8),"GetNamedBufferParameteriv has not returned a data.",
                 0x32);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (local_194 == 1) {
        return true;
      }
      local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_190 + 8),"Input buffer storage is unexpectedly mutable.",0x2d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),"GetNamedBufferParameteriv has failed.",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base(local_118);
  return false;
}

Assistant:

bool FunctionalTest::CheckArrayBufferImmutableFlag()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Local query storage. */
	glw::GLint is_storage_immutable = -1;

	/* Querry. */
	m_pGetNamedBufferParameteriv(m_bo_in, GL_BUFFER_IMMUTABLE_STORAGE, &is_storage_immutable);

	/* Error checking. */
	if (GL_NO_ERROR == gl.getError())
	{
		/* Return value checking. */
		if (-1 != is_storage_immutable)
		{
			/* Test. */
			if (GL_TRUE == is_storage_immutable)
			{
				return true;
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "Input buffer storage is unexpectedly mutable."
													<< tcu::TestLog::EndMessage;
			}
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "GetNamedBufferParameteriv has not returned a data."
												<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedBufferParameteriv has failed."
											<< tcu::TestLog::EndMessage;
	}

	return false;
}